

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O1

Transform * randomTransform(Transform *__return_storage_ptr__,RNG *rng)

{
  uint64_t uVar1;
  bool bVar2;
  bool bVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar20 [16];
  undefined1 in_ZMM0 [64];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM3 [64];
  undefined1 in_ZMM4 [64];
  undefined1 in_XMM5 [16];
  Vector3f delta;
  Vector3f axis;
  undefined1 local_158 [16];
  Transform local_128;
  Transform local_a8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  auVar22 = in_ZMM4._0_16_;
  auVar26 = in_ZMM3._0_16_;
  auVar12 = in_ZMM2._0_16_;
  auVar20 = in_ZMM0._0_16_;
  pbrt::Transform::Transform(__return_storage_ptr__);
  uVar9 = rng->state;
  uVar8 = (uint)(uVar9 >> 0x2d) ^ (uint)(uVar9 >> 0x1b);
  bVar10 = (byte)(uVar9 >> 0x3b);
  auVar20 = vcvtusi2ss_avx512f(auVar20,uVar8 >> bVar10 | uVar8 << 0x20 - bVar10);
  rng->state = uVar9 * 0x5851f42d4c957f2d + rng->inc;
  auVar20 = vminss_avx(ZEXT416((uint)(auVar20._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * 4.0)),
                            ZEXT416((uint)(1.0 - auVar20._0_4_)),ZEXT416(0xc0800000));
  dVar17 = pow(10.0,(double)auVar20._0_4_);
  uVar9 = rng->state;
  rng->state = uVar9 * 0x5851f42d4c957f2d + rng->inc;
  uVar8 = (uint)(uVar9 >> 0x2d) ^ (uint)(uVar9 >> 0x1b);
  bVar10 = (byte)(uVar9 >> 0x3b);
  auVar20 = vcvtusi2ss_avx512f(auVar12,uVar8 >> bVar10 | uVar8 << 0x20 - bVar10);
  auVar20 = vminss_avx(ZEXT416((uint)(auVar20._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * 4.0)),
                            ZEXT416((uint)(1.0 - auVar20._0_4_)),ZEXT416(0xc0800000));
  dVar18 = pow(10.0,(double)auVar20._0_4_);
  uVar9 = rng->state;
  rng->state = uVar9 * 0x5851f42d4c957f2d + rng->inc;
  uVar8 = (uint)(uVar9 >> 0x2d) ^ (uint)(uVar9 >> 0x1b);
  bVar10 = (byte)(uVar9 >> 0x3b);
  auVar20 = vcvtusi2ss_avx512f(auVar12,uVar8 >> bVar10 | uVar8 << 0x20 - bVar10);
  auVar20 = vminss_avx(ZEXT416((uint)(auVar20._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * 4.0)),
                            ZEXT416((uint)(1.0 - auVar20._0_4_)),ZEXT416(0xc0800000));
  dVar19 = pow(10.0,(double)auVar20._0_4_);
  pbrt::Scale(&local_128,(float)dVar17,(float)dVar18,(float)dVar19);
  pbrt::Transform::operator*(&local_a8,__return_storage_ptr__,&local_128);
  *(undefined8 *)(__return_storage_ptr__->mInv).m[0] = local_a8.mInv.m[0]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[0] + 2) = local_a8.mInv.m[0]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[1] = local_a8.mInv.m[1]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[1] + 2) = local_a8.mInv.m[1]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[2] = local_a8.mInv.m[2]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[2] + 2) = local_a8.mInv.m[2]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[3] = local_a8.mInv.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[3] + 2) = local_a8.mInv.m[3]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[0] = local_a8.m.m[0]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[0] + 2) = local_a8.m.m[0]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[1] = local_a8.m.m[1]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[1] + 2) = local_a8.m.m[1]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[2] = local_a8.m.m[2]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[2] + 2) = local_a8.m.m[2]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[3] = local_a8.m.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[3] + 2) = local_a8.m.m[3]._8_8_;
  uVar9 = rng->state;
  rng->state = uVar9 * 0x5851f42d4c957f2d + rng->inc;
  uVar8 = (uint)(uVar9 >> 0x2d) ^ (uint)(uVar9 >> 0x1b);
  bVar10 = (byte)(uVar9 >> 0x3b);
  auVar20 = vcvtusi2ss_avx512f(auVar26,uVar8 >> bVar10 | uVar8 << 0x20 - bVar10);
  auVar20 = vminss_avx(ZEXT416((uint)(auVar20._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * 8.0)),
                            ZEXT416((uint)(1.0 - auVar20._0_4_)),ZEXT416(0xc1000000));
  local_158._0_8_ = pow(10.0,(double)auVar20._0_4_);
  local_158._8_8_ = extraout_XMM0_Qb;
  uVar9 = rng->state;
  uVar11 = uVar9 * 0x5851f42d4c957f2d + rng->inc;
  rng->state = uVar11 * 0x5851f42d4c957f2d + rng->inc;
  uVar8 = (uint)(uVar11 >> 0x2d) ^ (uint)(uVar11 >> 0x1b);
  bVar10 = (byte)(uVar11 >> 0x3b);
  auVar20 = vcvtusi2ss_avx512f(auVar26,uVar8 >> bVar10 | uVar8 << 0x20 - bVar10);
  auVar20 = vminss_avx(ZEXT416((uint)(auVar20._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * 8.0)),
                            ZEXT416((uint)(1.0 - auVar20._0_4_)),ZEXT416(0xc1000000));
  auVar23._0_8_ = pow(10.0,(double)auVar20._0_4_);
  auVar23._8_56_ = extraout_var;
  uVar11 = rng->state * 0x5851f42d4c957f2d + rng->inc;
  auVar20 = vmovlhps_avx(local_158,auVar23._0_16_);
  auVar20 = vcvtpd2ps_avx(auVar20);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = rng->state;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar9;
  auVar26 = vpunpcklqdq_avx(auVar27,auVar25);
  auVar12 = vpsrlvq_avx2(auVar26,_DAT_005655c0);
  auVar13 = vpsrlvq_avx2(auVar26,_DAT_005655d0);
  auVar12 = vpshufd_avx(auVar12 ^ auVar13,0xe8);
  auVar26 = vpsrlq_avx(auVar26,0x3b);
  auVar26 = vpshufd_avx(auVar26,0xe8);
  auVar12 = vprorvd_avx512vl(auVar12,auVar26);
  auVar26 = vcvtudq2ps_avx512vl(auVar12);
  auVar12._8_4_ = 0x2f800000;
  auVar12._0_8_ = 0x2f8000002f800000;
  auVar12._12_4_ = 0x2f800000;
  auVar12 = vmulps_avx512vl(auVar26,auVar12);
  auVar26._8_4_ = 0x3f7fffff;
  auVar26._0_8_ = 0x3f7fffff3f7fffff;
  auVar26._12_4_ = 0x3f7fffff;
  auVar12 = vminps_avx512vl(auVar12,auVar26);
  auVar13._8_4_ = 0x3f000000;
  auVar13._0_8_ = 0x3f0000003f000000;
  auVar13._12_4_ = 0x3f000000;
  uVar9 = vcmpps_avx512vl(auVar12,auVar13,0xe);
  auVar6._8_4_ = 0x80000000;
  auVar6._0_8_ = 0x8000000080000000;
  auVar6._12_4_ = 0x80000000;
  auVar26 = vxorps_avx512vl(auVar20,auVar6);
  bVar2 = (bool)((byte)uVar9 & 1);
  bVar3 = (bool)((byte)(uVar9 >> 1) & 1);
  rng->state = uVar11 * 0x5851f42d4c957f2d + rng->inc;
  uVar8 = (uint)(uVar11 >> 0x2d) ^ (uint)(uVar11 >> 0x1b);
  bVar10 = (byte)(uVar11 >> 0x3b);
  auVar12 = vcvtusi2ss_avx512f(auVar22,uVar8 >> bVar10 | uVar8 << 0x20 - bVar10);
  auVar12 = vminss_avx(ZEXT416((uint)(auVar12._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ * 8.0)),
                            ZEXT416((uint)(1.0 - auVar12._0_4_)),ZEXT416(0xc1000000));
  auVar24._0_8_ = pow(10.0,(double)auVar12._0_4_);
  auVar24._8_56_ = extraout_var_00;
  auVar21._0_4_ = (float)auVar24._0_8_;
  auVar21._4_12_ = auVar24._4_12_;
  uVar9 = rng->state;
  uVar8 = (uint)(uVar9 >> 0x2d) ^ (uint)(uVar9 >> 0x1b);
  bVar10 = (byte)(uVar9 >> 0x3b);
  auVar12 = vcvtusi2ss_avx512f(auVar22,uVar8 >> bVar10 | uVar8 << 0x20 - bVar10);
  rng->state = uVar9 * 0x5851f42d4c957f2d + rng->inc;
  auVar12 = vminss_avx(ZEXT416((uint)(auVar12._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
  auVar7._8_4_ = 0x80000000;
  auVar7._0_8_ = 0x8000000080000000;
  auVar7._12_4_ = 0x80000000;
  auVar13 = vxorps_avx512vl(auVar21,auVar7);
  uVar4 = vcmpss_avx512f(auVar12,ZEXT416(0x3f000000),0xe);
  bVar5 = (bool)((byte)uVar4 & 1);
  delta.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)((uint)bVar5 * (int)auVar21._0_4_ + (uint)!bVar5 * auVar13._0_4_);
  delta.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)((uint)bVar2 * auVar20._0_4_ | (uint)!bVar2 * auVar26._0_4_);
  delta.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)((uint)bVar3 * auVar20._4_4_ | (uint)!bVar3 * auVar26._4_4_);
  pbrt::Translate(&local_128,delta);
  pbrt::Transform::operator*(&local_a8,__return_storage_ptr__,&local_128);
  *(undefined8 *)(__return_storage_ptr__->mInv).m[0] = local_a8.mInv.m[0]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[0] + 2) = local_a8.mInv.m[0]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[1] = local_a8.mInv.m[1]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[1] + 2) = local_a8.mInv.m[1]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[2] = local_a8.mInv.m[2]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[2] + 2) = local_a8.mInv.m[2]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[3] = local_a8.mInv.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[3] + 2) = local_a8.mInv.m[3]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[0] = local_a8.m.m[0]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[0] + 2) = local_a8.m.m[0]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[1] = local_a8.m.m[1]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[1] + 2) = local_a8.m.m[1]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[2] = local_a8.m.m[2]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[2] + 2) = local_a8.m.m[2]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[3] = local_a8.m.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[3] + 2) = local_a8.m.m[3]._8_8_;
  uVar9 = rng->state;
  uVar1 = rng->inc;
  uVar11 = uVar9 * 0x5851f42d4c957f2d + uVar1;
  uVar8 = (uint)(uVar9 >> 0x2d) ^ (uint)(uVar9 >> 0x1b);
  bVar10 = (byte)(uVar9 >> 0x3b);
  auVar20 = vcvtusi2ss_avx512f(auVar22,uVar8 >> bVar10 | uVar8 << 0x20 - bVar10);
  auVar13 = SUB6416(ZEXT464(0x3f7fffff),0);
  auVar20 = vminss_avx(ZEXT416((uint)(auVar20._0_4_ * 2.3283064e-10)),auVar13);
  uVar9 = uVar11 * 0x5851f42d4c957f2d + uVar1;
  rng->state = uVar9;
  uVar8 = (uint)(uVar11 >> 0x2d) ^ (uint)(uVar11 >> 0x1b);
  bVar10 = (byte)(uVar11 >> 0x3b);
  auVar12 = vcvtusi2ss_avx512f(auVar22,uVar8 >> bVar10 | uVar8 << 0x20 - bVar10);
  auVar12 = vminss_avx(ZEXT416((uint)(auVar12._0_4_ * 2.3283064e-10)),auVar13);
  rng->state = uVar9 * 0x5851f42d4c957f2d + uVar1;
  uVar8 = (uint)(uVar9 >> 0x2d) ^ (uint)(uVar9 >> 0x1b);
  bVar10 = (byte)(uVar9 >> 0x3b);
  auVar26 = vcvtusi2ss_avx512f(in_XMM5,uVar8 >> bVar10 | uVar8 << 0x20 - bVar10);
  auVar26 = vminss_avx(ZEXT416((uint)(auVar26._0_4_ * 2.3283064e-10)),auVar13);
  auVar22._0_8_ = (double)auVar26._0_4_;
  auVar22._8_8_ = auVar26._8_8_;
  auVar26 = vfmadd213sd_fma(auVar22,ZEXT816(0x4034000000000000),ZEXT816(0xc024000000000000));
  auVar20 = vfmadd132ss_fma(auVar20,SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
  axis.super_Tuple3<pbrt::Vector3,_float>.z = auVar20._0_4_;
  auVar20 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar20,auVar20);
  auVar20 = vmaxss_avx(auVar20,ZEXT816(0));
  if (auVar20._0_4_ < 0.0) {
    fVar16 = sqrtf(auVar20._0_4_);
  }
  else {
    auVar20 = vsqrtss_avx(auVar20,auVar20);
    fVar16 = auVar20._0_4_;
  }
  fVar15 = auVar12._0_4_ * 6.2831855;
  fVar14 = cosf(fVar15);
  fVar15 = sinf(fVar15);
  auVar20 = vinsertps_avx(ZEXT416((uint)(fVar14 * fVar16)),ZEXT416((uint)(fVar15 * fVar16)),0x10);
  fVar16 = (float)(auVar26._0_8_ * 20.0) * 0.017453292;
  fVar15 = sinf(fVar16);
  fVar16 = cosf(fVar16);
  local_158._0_8_ = auVar20._0_8_;
  axis.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_158._0_4_;
  axis.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_158._4_4_;
  pbrt::Rotate(&local_128,fVar15,fVar16,axis);
  pbrt::Transform::operator*(&local_a8,__return_storage_ptr__,&local_128);
  *(undefined8 *)(__return_storage_ptr__->mInv).m[0] = local_a8.mInv.m[0]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[0] + 2) = local_a8.mInv.m[0]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[1] = local_a8.mInv.m[1]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[1] + 2) = local_a8.mInv.m[1]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[2] = local_a8.mInv.m[2]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[2] + 2) = local_a8.mInv.m[2]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[3] = local_a8.mInv.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[3] + 2) = local_a8.mInv.m[3]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[0] = local_a8.m.m[0]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[0] + 2) = local_a8.m.m[0]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[1] = local_a8.m.m[1]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[1] + 2) = local_a8.m.m[1]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[2] = local_a8.m.m[2]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[2] + 2) = local_a8.m.m[2]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[3] = local_a8.m.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[3] + 2) = local_a8.m.m[3]._8_8_;
  return __return_storage_ptr__;
}

Assistant:

static Transform randomTransform(RNG &rng) {
    Transform t;
    auto rr = [&rng]() { return -10. + 20. * rng.Uniform<Float>(); };
    auto rt = [&rng]() {
        Float f = pExp(rng);
        return rng.Uniform<Float>() > .5 ? f : -f;
    };

    for (int i = 0; i < 1; ++i) {
        const Float s[3] = {pExp(rng, 4), pExp(rng, 4), pExp(rng, 4)};
        t = t * Scale(s[0], s[1], s[2]);
        t = t * Translate(Vector3f{rt(), rt(), rt()});
        Point2f u{rng.Uniform<Float>(), rng.Uniform<Float>()};
        t = t * Rotate(rr() * 20., SampleUniformSphere(u));
    }
    return t;
}